

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finder.hpp
# Opt level: O3

iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall
boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>::operator()
          (void *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          Begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                End)

{
  ulong __n;
  bool bVar1;
  anon_union_16_2_ba345be5_for_m_Storage *__dest;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  void *__src;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  iVar5;
  anon_union_16_2_ba345be5_for_m_Storage local_38;
  ulong local_28;
  
  __dest = &local_38;
  __n = *(ulong *)((long)this + 0x10);
  local_38.m_dynSet = (set_value_type *)0x0;
  __src = this;
  local_28 = __n;
  if (0x10 < __n) {
    __dest = (anon_union_16_2_ba345be5_for_m_Storage *)operator_new__(__n);
    __src = *this;
    local_38.m_dynSet = (set_value_type *)__dest;
  }
  memcpy(__dest,__src,__n);
  _Var2 = std::
          find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,boost::algorithm::detail::is_any_ofF<char>>
                    (Begin,End,(is_any_ofF<char> *)&local_38);
  if ((0x10 < local_28) && (local_38.m_dynSet != (set_value_type *)0x0)) {
    operator_delete__(local_38.m_dynSet);
  }
  _Var3._M_current = End._M_current;
  _Var4._M_current = End._M_current;
  if (_Var2._M_current != End._M_current) {
    _Var3 = _Var2;
    _Var4 = _Var2;
    if (*(int *)((long)this + 0x18) == 0) {
      do {
        bVar1 = is_any_ofF<char>::operator()((is_any_ofF<char> *)this,*_Var3._M_current);
        if (!bVar1) break;
        _Var3._M_current = _Var3._M_current + 1;
      } while (_Var3._M_current != End._M_current);
    }
    else {
      _Var3._M_current = _Var2._M_current + 1;
    }
  }
  iVar5.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = _Var3._M_current;
  iVar5.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current = _Var4._M_current;
  return (iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )iVar5.
           super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  ;
}

Assistant:

iterator_range<ForwardIteratorT>
                operator()(
                    ForwardIteratorT Begin,
                    ForwardIteratorT End ) const
                {
                    typedef iterator_range<ForwardIteratorT> result_type;

                    ForwardIteratorT It=std::find_if( Begin, End, m_Pred );

                    if( It==End )
                    {
                        return result_type( End, End );
                    }
                    else
                    {
                        ForwardIteratorT It2=It;

                        if( m_eCompress==token_compress_on )
                        {
                            // Find first non-matching character
                            while( It2!=End && m_Pred(*It2) ) ++It2;
                        }
                        else
                        {
                            // Advance by one position
                            ++It2;
                        }

                        return result_type( It, It2 );
                    }
                }